

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

bitarr_address_t middle_find(middle_t *middle,uint32 word,node_range_t *range)

{
  uint8 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  uint8 *puVar5;
  bitarr_address_t bVar6;
  bitarr_address_t address;
  bitarr_address_t address_00;
  uint32 *in_stack_ffffffffffffffc0;
  uint32 at_pointer;
  
  uVar1 = uniform_find((middle->base).base,(middle->base).total_bits,(middle->base).word_bits,
                       (middle->base).word_mask,range->begin - 1,range->end,(middle->base).max_vocab
                       ,word,(uint32)&at_pointer,in_stack_ffffffffffffffc0);
  if (uVar1 == '\0') {
    puVar5 = (uint8 *)0x0;
    uVar3 = 0;
  }
  else {
    puVar5 = (middle->base).base;
    uVar3 = (uint)(middle->base).word_bits + (middle->base).total_bits * at_pointer;
    iVar4 = middle->quant_bits + uVar3;
    address.offset = iVar4;
    address.base = puVar5;
    address._12_4_ = 0;
    at_pointer = uVar3;
    uVar2 = bitarr_read_int25(address,(middle->next_mask).bits,(middle->next_mask).mask);
    range->begin = uVar2;
    address_00.offset = (uint)(middle->base).total_bits + iVar4;
    address_00.base = puVar5;
    address_00._12_4_ = 0;
    uVar2 = bitarr_read_int25(address_00,(middle->next_mask).bits,(middle->next_mask).mask);
    range->end = uVar2;
  }
  bVar6.offset = uVar3;
  bVar6.base = puVar5;
  bVar6._12_4_ = 0;
  return bVar6;
}

Assistant:

static bitarr_address_t
middle_find(middle_t * middle, uint32 word, node_range_t * range)
{
    uint32 at_pointer;
    bitarr_address_t address;

    /* finding BitPacked with uniform find */
    if (!uniform_find
        ((void *) middle->base.base, middle->base.total_bits,
         middle->base.word_bits, middle->base.word_mask, range->begin - 1,
         0, range->end, middle->base.max_vocab, word, &at_pointer)) {
        address.base = NULL;
        address.offset = 0;
        return address;
    }

    address.base = middle->base.base;
    at_pointer *= middle->base.total_bits;
    at_pointer += middle->base.word_bits;
    address.offset = at_pointer + middle->quant_bits;
    range->begin =
        bitarr_read_int25(address, middle->next_mask.bits,
                          middle->next_mask.mask);
    address.offset += middle->base.total_bits;
    range->end =
        bitarr_read_int25(address, middle->next_mask.bits,
                          middle->next_mask.mask);
    address.offset = at_pointer;

    return address;
}